

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

bool __thiscall Jinx::Impl::Parser::CheckValueType(Parser *this,SymbolListCItr currSym)

{
  SymbolType SVar1;
  pointer pSVar2;
  bool local_39;
  bool local_2d;
  const_iterator cStack_28;
  SymbolType type;
  Parser *local_20;
  Parser *this_local;
  SymbolListCItr currSym_local;
  
  local_2d = true;
  local_20 = this;
  this_local = (Parser *)currSym._M_current;
  if ((this->m_error & 1U) == 0) {
    cStack_28 = std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                          (this->m_symbolList);
    local_2d = __gnu_cxx::operator==
                         ((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                           *)&this_local,&stack0xffffffffffffffd8);
  }
  if (local_2d == false) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                           *)&this_local);
    SVar1 = pSVar2->type;
    local_39 = true;
    if (((((SVar1 != Number) && (local_39 = true, SVar1 != Integer)) &&
         (local_39 = true, SVar1 != Boolean)) &&
        ((local_39 = true, SVar1 != String && (local_39 = true, SVar1 != Collection)))) &&
       ((local_39 = true, SVar1 != Function &&
        ((local_39 = true, SVar1 != Coroutine && (local_39 = true, SVar1 != Guid)))))) {
      local_39 = SVar1 == Null;
    }
    currSym_local._M_current._7_1_ = local_39;
  }
  else {
    currSym_local._M_current._7_1_ = false;
  }
  return currSym_local._M_current._7_1_;
}

Assistant:

inline_t bool Parser::CheckValueType(SymbolListCItr currSym) const
	{
		if (m_error || currSym == m_symbolList.end())
			return false;
		auto type = currSym->type;
		return
			type == SymbolType::Number ||
			type == SymbolType::Integer ||
			type == SymbolType::Boolean ||
			type == SymbolType::String ||
			type == SymbolType::Collection ||
			type == SymbolType::Function ||
			type == SymbolType::Coroutine ||
			type == SymbolType::Guid ||
			type == SymbolType::Null;

	}